

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  long *pInLimit;
  long *plVar2;
  BYTE *pBVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  long lVar12;
  BYTE *pBVar13;
  undefined8 uVar14;
  char cVar15;
  size_t sVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  long *plVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  long *plVar26;
  long *plVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  long *plVar34;
  seqDef *psVar35;
  U32 UVar36;
  uint uVar37;
  ulong uVar38;
  long *plVar39;
  BYTE *litEnd;
  uint local_d4;
  long *local_c8;
  BYTE *litLimit_w_3;
  BYTE *litLimit_w;
  BYTE *litLimit_w_1;
  BYTE *litLimit_w_2;
  
  pBVar9 = (ms->window).base;
  pInLimit = (long *)((long)src + srcSize);
  iVar33 = (int)pBVar9;
  iVar23 = (int)pInLimit - iVar33;
  uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar37 = (ms->window).dictLimit;
  uVar19 = iVar23 - uVar30;
  if (iVar23 - uVar37 <= uVar30) {
    uVar19 = uVar37;
  }
  if (ms->loadedDictEnd != 0) {
    uVar19 = uVar37;
  }
  plVar2 = (long *)(pBVar9 + uVar19);
  litEnd = (BYTE *)((ulong)(plVar2 == (long *)src) + (long)src);
  iVar23 = (int)litEnd - iVar33;
  uVar24 = iVar23 - uVar30;
  if (iVar23 - uVar37 <= uVar30) {
    uVar24 = uVar37;
  }
  uVar30 = rep[1];
  if (ms->loadedDictEnd != 0) {
    uVar24 = uVar37;
  }
  uVar24 = iVar23 - uVar24;
  local_d4 = uVar30;
  if (uVar24 < uVar30) {
    local_d4 = 0;
  }
  uVar38 = (ulong)local_d4;
  uVar37 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  uVar5 = (ms->cParams).hashLog;
  pUVar11 = ms->chainTable;
  uVar6 = (ms->cParams).chainLog;
  plVar27 = (long *)((long)src + (srcSize - 8));
  uVar7 = *rep;
  uVar31 = 0;
  if (uVar7 <= uVar24) {
    uVar31 = (ulong)uVar7;
  }
  bVar17 = 0x40 - (char)uVar5;
  cVar15 = (char)uVar6;
  local_c8 = (long *)src;
  if (uVar37 == 5) {
    bVar18 = 0x40 - cVar15;
    plVar1 = pInLimit + -4;
LAB_001b1d45:
    uVar37 = (uint)uVar31;
    local_d4 = (uint)uVar38;
    if (litEnd + 1 <= plVar27) {
      if ((uVar5 < 0x21) && (uVar6 < 0x21)) {
        uVar25 = (ulong)(*(long *)litEnd * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
        uVar32 = (ulong)pUVar10[uVar25];
        plVar39 = (long *)(pBVar9 + uVar32);
        plVar20 = (long *)(litEnd + 0x100);
        uVar21 = 1;
        lVar22 = *(long *)litEnd;
        plVar34 = (long *)(litEnd + 1);
        while( true ) {
          plVar26 = plVar34;
          uVar29 = (ulong)(lVar22 * -0x30e4432345000000) >> (bVar18 & 0x3f);
          uVar8 = pUVar11[uVar29];
          UVar36 = (int)litEnd - iVar33;
          pUVar11[uVar29] = UVar36;
          pUVar10[uVar25] = UVar36;
          if ((uVar37 != 0) && (*(int *)(litEnd + -uVar31 + 1) == *(int *)(litEnd + 1))) break;
          lVar12 = *plVar26;
          uVar25 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
          if ((uVar19 < (uint)uVar32) && (*plVar39 == lVar22)) {
            sVar16 = ZSTD_count(litEnd + 8,(BYTE *)(plVar39 + 1),(BYTE *)pInLimit);
            uVar32 = sVar16 + 8;
            uVar29 = (long)litEnd - (long)plVar39;
            for (; ((plVar2 < plVar39 && (local_c8 < litEnd)) &&
                   (*(char *)((long)litEnd + -1) == *(char *)((long)plVar39 + -1)));
                litEnd = (BYTE *)((long)litEnd + -1)) {
              plVar39 = (long *)((long)plVar39 + -1);
              uVar32 = uVar32 + 1;
            }
            goto LAB_001b2114;
          }
          uVar32 = (ulong)pUVar10[uVar25];
          plVar39 = (long *)(pBVar9 + uVar32);
          if ((uVar19 < uVar8) &&
             (plVar34 = (long *)(pBVar9 + uVar8), (int)*plVar34 == *(int *)litEnd))
          goto LAB_001b2098;
          if (plVar20 <= plVar26) {
            uVar21 = uVar21 + 1;
            plVar20 = plVar20 + 0x20;
          }
          lVar22 = lVar12;
          plVar34 = (long *)((long)plVar26 + uVar21);
          litEnd = (BYTE *)plVar26;
          if (plVar27 < (long *)((long)plVar26 + uVar21)) goto LAB_001b2e05;
        }
        sVar16 = ZSTD_count(litEnd + 5,litEnd + -uVar31 + 5,(BYTE *)pInLimit);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001b2ea1;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
        litEnd = litEnd + 1;
        uVar21 = (long)litEnd - (long)local_c8;
        plVar34 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar34 + uVar21))
        goto LAB_001b2ec0;
        if (pInLimit < litEnd) goto LAB_001b2edf;
        if (plVar1 < litEnd) {
          ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)local_c8,litEnd,(BYTE *)plVar1);
          goto LAB_001b1f6e;
        }
        lVar22 = local_c8[1];
        *plVar34 = *local_c8;
        plVar34[1] = lVar22;
        pBVar13 = seqStore->lit;
        if (uVar21 < 0x11) {
          seqStore->lit = pBVar13 + uVar21;
          goto LAB_001b22d4;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar13 + 0x10) + (-0x10 - (long)(local_c8 + 2))))
        goto LAB_001b2f7a;
        lVar22 = local_c8[3];
        *(long *)(pBVar13 + 0x10) = local_c8[2];
        *(long *)(pBVar13 + 0x18) = lVar22;
        if (0x20 < (long)uVar21) {
          lVar22 = 0;
          do {
            puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x20);
            uVar14 = puVar4[1];
            pBVar3 = pBVar13 + lVar22 + 0x20;
            *(undefined8 *)pBVar3 = *puVar4;
            *(undefined8 *)(pBVar3 + 8) = uVar14;
            puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x30);
            uVar14 = puVar4[1];
            *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
            *(undefined8 *)(pBVar3 + 0x18) = uVar14;
            lVar22 = lVar22 + 0x20;
          } while (pBVar3 + 0x20 < pBVar13 + uVar21);
        }
LAB_001b1f6e:
        seqStore->lit = seqStore->lit + uVar21;
        if (0xffff < uVar21) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2f5b;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_001b22d4:
        uVar32 = sVar16 + 4;
        psVar35 = seqStore->sequences;
        psVar35->litLength = (U16)uVar21;
        psVar35->offBase = 1;
        if (2 < uVar32) {
          uVar21 = sVar16 + 1;
          uVar25 = uVar31;
          if (uVar21 < 0x10000) goto LAB_001b2379;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001b2358;
          goto LAB_001b2efe;
        }
        goto LAB_001b2e63;
      }
      goto LAB_001b2f1d;
    }
    goto LAB_001b2e05;
  }
  if (uVar37 == 6) {
    bVar18 = 0x40 - cVar15;
    plVar1 = pInLimit + -4;
LAB_001b14d2:
    uVar37 = (uint)uVar31;
    local_d4 = (uint)uVar38;
    if (litEnd + 1 <= plVar27) {
      if ((uVar5 < 0x21) && (uVar6 < 0x21)) {
        uVar25 = (ulong)(*(long *)litEnd * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
        uVar32 = (ulong)pUVar10[uVar25];
        plVar39 = (long *)(pBVar9 + uVar32);
        plVar20 = (long *)(litEnd + 0x100);
        uVar21 = 1;
        lVar22 = *(long *)litEnd;
        plVar34 = (long *)(litEnd + 1);
        while( true ) {
          plVar26 = plVar34;
          uVar29 = (ulong)(lVar22 * -0x30e4432340650000) >> (bVar18 & 0x3f);
          uVar8 = pUVar11[uVar29];
          UVar36 = (int)litEnd - iVar33;
          pUVar11[uVar29] = UVar36;
          pUVar10[uVar25] = UVar36;
          if ((uVar37 != 0) &&
             (*(int *)(litEnd + -(uVar31 & 0xffffffff) + 1) == *(int *)(litEnd + 1))) break;
          lVar12 = *plVar26;
          uVar25 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
          if ((uVar19 < (uint)uVar32) && (*plVar39 == lVar22)) {
            sVar16 = ZSTD_count(litEnd + 8,(BYTE *)(plVar39 + 1),(BYTE *)pInLimit);
            uVar29 = sVar16 + 8;
            uVar32 = (long)litEnd - (long)plVar39;
            for (; ((plVar2 < plVar39 && (local_c8 < litEnd)) &&
                   (litEnd[-1] == *(BYTE *)((long)plVar39 + -1))); litEnd = litEnd + -1) {
              plVar39 = (long *)((long)plVar39 + -1);
              uVar29 = uVar29 + 1;
            }
            goto LAB_001b1882;
          }
          uVar32 = (ulong)pUVar10[uVar25];
          plVar39 = (long *)(pBVar9 + uVar32);
          if ((uVar19 < uVar8) &&
             (plVar34 = (long *)(pBVar9 + uVar8), (int)*plVar34 == *(int *)litEnd))
          goto LAB_001b1807;
          if (plVar20 <= plVar26) {
            uVar21 = uVar21 + 1;
            plVar20 = plVar20 + 0x20;
          }
          lVar22 = lVar12;
          plVar34 = (long *)((long)plVar26 + uVar21);
          litEnd = (BYTE *)plVar26;
          if (plVar27 < (long *)((long)plVar26 + uVar21)) goto LAB_001b2e05;
        }
        uVar32 = uVar31 & 0xffffffff;
        sVar16 = ZSTD_count(litEnd + 5,litEnd + -(uVar31 & 0xffffffff) + 5,(BYTE *)pInLimit);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001b2ea1;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
        litEnd = litEnd + 1;
        uVar31 = (long)litEnd - (long)local_c8;
        plVar34 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar34 + uVar31))
        goto LAB_001b2ec0;
        if (pInLimit < litEnd) goto LAB_001b2edf;
        if (plVar1 < litEnd) {
          ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)local_c8,litEnd,(BYTE *)plVar1);
          goto LAB_001b16db;
        }
        lVar22 = local_c8[1];
        *plVar34 = *local_c8;
        plVar34[1] = lVar22;
        pBVar13 = seqStore->lit;
        if (uVar31 < 0x11) {
          seqStore->lit = pBVar13 + uVar31;
          goto LAB_001b1a54;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar13 + 0x10) + (-0x10 - (long)(local_c8 + 2))))
        goto LAB_001b2f7a;
        lVar22 = local_c8[3];
        *(long *)(pBVar13 + 0x10) = local_c8[2];
        *(long *)(pBVar13 + 0x18) = lVar22;
        if (0x20 < (long)uVar31) {
          lVar22 = 0;
          do {
            puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x20);
            uVar14 = puVar4[1];
            pBVar3 = pBVar13 + lVar22 + 0x20;
            *(undefined8 *)pBVar3 = *puVar4;
            *(undefined8 *)(pBVar3 + 8) = uVar14;
            puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x30);
            uVar14 = puVar4[1];
            *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
            *(undefined8 *)(pBVar3 + 0x18) = uVar14;
            lVar22 = lVar22 + 0x20;
          } while (pBVar3 + 0x20 < pBVar13 + uVar31);
        }
LAB_001b16db:
        seqStore->lit = seqStore->lit + uVar31;
        if (0xffff < uVar31) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2f5b;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_001b1a54:
        uVar29 = sVar16 + 4;
        psVar35 = seqStore->sequences;
        psVar35->litLength = (U16)uVar31;
        psVar35->offBase = 1;
        if (2 < uVar29) {
          uVar21 = sVar16 + 1;
          if (uVar21 < 0x10000) goto LAB_001b1ae5;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001b1aca;
          goto LAB_001b2efe;
        }
        goto LAB_001b2e63;
      }
      goto LAB_001b2f1d;
    }
    goto LAB_001b2e05;
  }
  if (uVar37 != 7) {
    bVar18 = 0x20 - cVar15;
    plVar1 = pInLimit + -4;
LAB_001b25c3:
    uVar37 = (uint)uVar31;
    if (litEnd + 1 <= plVar27) {
      if ((uVar5 < 0x21) && (uVar6 < 0x21)) {
        lVar22 = *(long *)litEnd;
        uVar21 = (ulong)(lVar22 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
        uVar25 = (ulong)pUVar10[uVar21];
        plVar39 = (long *)(pBVar9 + uVar25);
        plVar20 = (long *)(litEnd + 0x100);
        uVar38 = 1;
        plVar34 = (long *)(litEnd + 1);
        while( true ) {
          plVar26 = plVar34;
          uVar28 = (uint)((int)lVar22 * -0x61c8864f) >> (bVar18 & 0x1f);
          uVar8 = pUVar11[uVar28];
          UVar36 = (int)litEnd - iVar33;
          pUVar11[uVar28] = UVar36;
          pUVar10[uVar21] = UVar36;
          if ((uVar37 != 0) && (*(int *)(litEnd + -uVar31 + 1) == *(int *)(litEnd + 1))) break;
          lVar22 = *plVar26;
          uVar21 = (ulong)(lVar22 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
          if ((uVar19 < (uint)uVar25) && (*plVar39 == *(long *)litEnd)) {
            sVar16 = ZSTD_count(litEnd + 8,(BYTE *)(plVar39 + 1),(BYTE *)pInLimit);
            uVar25 = sVar16 + 8;
            uVar31 = (long)litEnd - (long)plVar39;
            for (; ((plVar2 < plVar39 && (local_c8 < litEnd)) &&
                   (litEnd[-1] == *(BYTE *)((long)plVar39 + -1))); litEnd = litEnd + -1) {
              plVar39 = (long *)((long)plVar39 + -1);
              uVar25 = uVar25 + 1;
            }
            goto LAB_001b29e0;
          }
          uVar25 = (ulong)pUVar10[uVar21];
          plVar39 = (long *)(pBVar9 + uVar25);
          if ((uVar19 < uVar8) &&
             (plVar34 = (long *)(pBVar9 + uVar8), (int)*plVar34 == *(int *)litEnd))
          goto LAB_001b28ef;
          if (plVar20 <= plVar26) {
            uVar38 = uVar38 + 1;
            plVar20 = plVar20 + 0x20;
          }
          plVar34 = (long *)(uVar38 + (long)plVar26);
          litEnd = (BYTE *)plVar26;
          if (plVar27 < (long *)(uVar38 + (long)plVar26)) goto LAB_001b2e05;
        }
        sVar16 = ZSTD_count(litEnd + 5,litEnd + -uVar31 + 5,(BYTE *)pInLimit);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001b2ea1;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
        litEnd = litEnd + 1;
        uVar38 = (long)litEnd - (long)local_c8;
        plVar34 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar34 + uVar38))
        goto LAB_001b2ec0;
        if (pInLimit < litEnd) goto LAB_001b2edf;
        if (plVar1 < litEnd) {
          ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)local_c8,litEnd,(BYTE *)plVar1);
          goto LAB_001b27b3;
        }
        lVar22 = local_c8[1];
        *plVar34 = *local_c8;
        plVar34[1] = lVar22;
        pBVar13 = seqStore->lit;
        if (uVar38 < 0x11) {
          seqStore->lit = pBVar13 + uVar38;
          goto LAB_001b2b37;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar13 + 0x10) + (-0x10 - (long)(local_c8 + 2))))
        goto LAB_001b2f7a;
        lVar22 = local_c8[3];
        *(long *)(pBVar13 + 0x10) = local_c8[2];
        *(long *)(pBVar13 + 0x18) = lVar22;
        if (0x20 < (long)uVar38) {
          lVar22 = 0;
          do {
            puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x20);
            uVar14 = puVar4[1];
            pBVar3 = pBVar13 + lVar22 + 0x20;
            *(undefined8 *)pBVar3 = *puVar4;
            *(undefined8 *)(pBVar3 + 8) = uVar14;
            puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x30);
            uVar14 = puVar4[1];
            *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
            *(undefined8 *)(pBVar3 + 0x18) = uVar14;
            lVar22 = lVar22 + 0x20;
          } while (pBVar3 + 0x20 < pBVar13 + uVar38);
        }
LAB_001b27b3:
        seqStore->lit = seqStore->lit + uVar38;
        if (0xffff < uVar38) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2f5b;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_001b2b37:
        uVar25 = sVar16 + 4;
        psVar35 = seqStore->sequences;
        psVar35->litLength = (U16)uVar38;
        psVar35->offBase = 1;
        if (2 < uVar25) {
          uVar38 = sVar16 + 1;
          if (uVar38 < 0x10000) goto LAB_001b2bd5;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001b2bb6;
          goto LAB_001b2efe;
        }
        goto LAB_001b2e63;
      }
      goto LAB_001b2f1d;
    }
    goto LAB_001b2e05;
  }
  bVar18 = 0x40 - cVar15;
  plVar1 = pInLimit + -4;
LAB_001b0c47:
  uVar37 = (uint)uVar31;
  if (plVar27 < litEnd + 1) {
LAB_001b2e05:
    if (uVar30 <= uVar24) {
      uVar30 = 0;
    }
    uVar19 = uVar30;
    if (uVar37 != 0) {
      uVar19 = uVar7;
    }
    if (uVar7 <= uVar24) {
      uVar19 = uVar30;
      uVar7 = 0;
    }
    if (uVar37 != 0) {
      uVar7 = uVar37;
    }
    if (local_d4 != 0) {
      uVar19 = local_d4;
    }
    *rep = uVar7;
    rep[1] = uVar19;
    return (long)pInLimit - (long)local_c8;
  }
  if ((0x20 < uVar5) || (0x20 < uVar6)) {
LAB_001b2f1d:
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  uVar21 = uVar31 & 0xffffffff;
  uVar25 = (ulong)(*(long *)litEnd * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
  uVar32 = (ulong)pUVar10[uVar25];
  plVar39 = (long *)(pBVar9 + uVar32);
  plVar20 = (long *)(litEnd + 0x100);
  uVar38 = 1;
  plVar34 = (long *)(litEnd + 1);
  lVar22 = *(long *)litEnd;
  while( true ) {
    plVar26 = plVar34;
    uVar29 = (ulong)(lVar22 * -0x30e44323405a9d00) >> (bVar18 & 0x3f);
    uVar8 = pUVar11[uVar29];
    UVar36 = (int)litEnd - iVar33;
    pUVar11[uVar29] = UVar36;
    pUVar10[uVar25] = UVar36;
    if ((uVar37 != 0) && (*(int *)(litEnd + -uVar21 + 1) == *(int *)(litEnd + 1))) break;
    lVar12 = *plVar26;
    uVar25 = (ulong)(lVar12 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
    if ((uVar19 < (uint)uVar32) && (*plVar39 == lVar22)) {
      sVar16 = ZSTD_count(litEnd + 8,(BYTE *)(plVar39 + 1),(BYTE *)pInLimit);
      uVar21 = sVar16 + 8;
      uVar31 = (long)litEnd - (long)plVar39;
      for (; ((plVar2 < plVar39 && (local_c8 < litEnd)) &&
             (litEnd[-1] == *(BYTE *)((long)plVar39 + -1))); litEnd = litEnd + -1) {
        plVar39 = (long *)((long)plVar39 + -1);
        uVar21 = uVar21 + 1;
      }
      goto LAB_001b0fe8;
    }
    uVar32 = (ulong)pUVar10[uVar25];
    plVar39 = (long *)(pBVar9 + uVar32);
    if ((uVar19 < uVar8) && (plVar34 = (long *)(pBVar9 + uVar8), (int)*plVar34 == *(int *)litEnd))
    goto LAB_001b0f6d;
    if (plVar20 <= plVar26) {
      uVar38 = uVar38 + 1;
      plVar20 = plVar20 + 0x20;
    }
    plVar34 = (long *)(uVar38 + (long)plVar26);
    lVar22 = lVar12;
    litEnd = (BYTE *)plVar26;
    if (plVar27 < (long *)(uVar38 + (long)plVar26)) goto LAB_001b2e05;
  }
  uVar31 = uVar31 & 0xffffffff;
  sVar16 = ZSTD_count(litEnd + 5,litEnd + -uVar21 + 5,(BYTE *)pInLimit);
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001b2ea1;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
  litEnd = litEnd + 1;
  uVar38 = (long)litEnd - (long)local_c8;
  plVar34 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar34 + uVar38)) goto LAB_001b2ec0;
  if (pInLimit < litEnd) goto LAB_001b2edf;
  if (plVar1 < litEnd) {
    ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)local_c8,litEnd,(BYTE *)plVar1);
    goto LAB_001b0e3b;
  }
  lVar22 = local_c8[1];
  *plVar34 = *local_c8;
  plVar34[1] = lVar22;
  pBVar13 = seqStore->lit;
  if (uVar38 < 0x11) {
    seqStore->lit = pBVar13 + uVar38;
    goto LAB_001b11c9;
  }
  if (0xffffffffffffffe0 < (ulong)((long)(pBVar13 + 0x10) + (-0x10 - (long)(local_c8 + 2))))
  goto LAB_001b2f7a;
  lVar22 = local_c8[3];
  *(long *)(pBVar13 + 0x10) = local_c8[2];
  *(long *)(pBVar13 + 0x18) = lVar22;
  if (0x20 < (long)uVar38) {
    lVar22 = 0;
    do {
      puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x20);
      uVar14 = puVar4[1];
      pBVar3 = pBVar13 + lVar22 + 0x20;
      *(undefined8 *)pBVar3 = *puVar4;
      *(undefined8 *)(pBVar3 + 8) = uVar14;
      puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x30);
      uVar14 = puVar4[1];
      *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
      *(undefined8 *)(pBVar3 + 0x18) = uVar14;
      lVar22 = lVar22 + 0x20;
    } while (pBVar3 + 0x20 < pBVar13 + uVar38);
  }
LAB_001b0e3b:
  seqStore->lit = seqStore->lit + uVar38;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2f5b;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b11c9:
  uVar21 = sVar16 + 4;
  psVar35 = seqStore->sequences;
  psVar35->litLength = (U16)uVar38;
  psVar35->offBase = 1;
  if (2 < uVar21) {
    uVar38 = sVar16 + 1;
    if (uVar38 < 0x10000) goto LAB_001b125c;
    if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001b1240;
LAB_001b2efe:
    __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2bf,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  goto LAB_001b2e63;
LAB_001b2098:
  if ((uVar19 < pUVar10[uVar25]) && (*plVar39 == lVar12)) {
    sVar16 = ZSTD_count((BYTE *)(plVar26 + 1),(BYTE *)(plVar39 + 1),(BYTE *)pInLimit);
    uVar32 = sVar16 + 8;
    uVar29 = (long)plVar26 - (long)plVar39;
    for (litEnd = (BYTE *)plVar26;
        ((plVar2 < plVar39 && (local_c8 < litEnd)) &&
        (*(char *)((long)litEnd + -1) == *(char *)((long)plVar39 + -1)));
        litEnd = (BYTE *)((long)litEnd + -1)) {
      plVar39 = (long *)((long)plVar39 + -1);
      uVar32 = uVar32 + 1;
    }
  }
  else {
    sVar16 = ZSTD_count(litEnd + 4,(BYTE *)((long)plVar34 + 4),(BYTE *)pInLimit);
    uVar32 = sVar16 + 4;
    uVar29 = (long)litEnd - (long)plVar34;
    for (; ((plVar2 < plVar34 && (local_c8 < litEnd)) &&
           (*(char *)((long)litEnd + -1) == *(char *)((long)plVar34 + -1)));
        litEnd = (BYTE *)((long)litEnd + -1)) {
      plVar34 = (long *)((long)plVar34 + -1);
      uVar32 = uVar32 + 1;
    }
  }
LAB_001b2114:
  if (uVar21 < 4) {
    pUVar10[uVar25] = (int)plVar26 - iVar33;
  }
  if ((int)uVar29 == 0) goto LAB_001b2f3c;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001b2ea1;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
  uVar38 = (long)litEnd - (long)local_c8;
  plVar34 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar34 + uVar38)) goto LAB_001b2ec0;
  if (pInLimit < litEnd) goto LAB_001b2edf;
  if (plVar1 < litEnd) {
    ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)local_c8,litEnd,(BYTE *)plVar1);
  }
  else {
    lVar22 = local_c8[1];
    *plVar34 = *local_c8;
    plVar34[1] = lVar22;
    pBVar13 = seqStore->lit;
    if (uVar38 < 0x11) {
      seqStore->lit = pBVar13 + uVar38;
      goto LAB_001b2316;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar13 + 0x10) + (-0x10 - (long)(local_c8 + 2))))
    goto LAB_001b2f7a;
    lVar22 = local_c8[3];
    *(long *)(pBVar13 + 0x10) = local_c8[2];
    *(long *)(pBVar13 + 0x18) = lVar22;
    if (0x20 < (long)uVar38) {
      lVar22 = 0;
      do {
        puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x20);
        uVar14 = puVar4[1];
        pBVar3 = pBVar13 + lVar22 + 0x20;
        *(undefined8 *)pBVar3 = *puVar4;
        *(undefined8 *)(pBVar3 + 8) = uVar14;
        puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x30);
        uVar14 = puVar4[1];
        *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
        *(undefined8 *)(pBVar3 + 0x18) = uVar14;
        lVar22 = lVar22 + 0x20;
      } while (pBVar3 + 0x20 < pBVar13 + uVar38);
    }
  }
  seqStore->lit = seqStore->lit + uVar38;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2f5b;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b2316:
  psVar35 = seqStore->sequences;
  psVar35->litLength = (U16)uVar38;
  psVar35->offBase = (int)uVar29 + 3;
  if (uVar32 < 3) goto LAB_001b2e63;
  uVar21 = uVar32 - 3;
  uVar38 = uVar31;
  if (uVar21 < 0x10000) {
    uVar25 = uVar29 & 0xffffffff;
  }
  else {
    uVar25 = uVar29 & 0xffffffff;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2efe;
LAB_001b2358:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b2379:
  litEnd = (BYTE *)((long)litEnd + uVar32);
  psVar35->mlBase = (U16)uVar21;
  psVar35 = psVar35 + 1;
  seqStore->sequences = psVar35;
  uVar31 = uVar25;
  local_c8 = (long *)litEnd;
  if (litEnd <= plVar27) {
    uVar37 = UVar36 + 2;
    lVar22 = *(long *)(pBVar9 + uVar37);
    pUVar10[(ulong)(lVar22 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = uVar37;
    pUVar10[(ulong)(*(long *)((long)litEnd + -2) * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] =
         ((int)litEnd + -2) - iVar33;
    pUVar11[(ulong)(lVar22 * -0x30e4432345000000) >> (bVar18 & 0x3f)] = uVar37;
    pUVar11[(ulong)(*(long *)((long)litEnd + -1) * -0x30e4432345000000) >> (bVar18 & 0x3f)] =
         ((int)litEnd + -1) - iVar33;
    for (; uVar31 = uVar25, litEnd <= plVar27; litEnd = litEnd + sVar16 + 4) {
      if (((int)uVar38 == 0) || (*(int *)litEnd != *(int *)(litEnd + -uVar38))) break;
      sVar16 = ZSTD_count(litEnd + 4,litEnd + (4 - uVar38),(BYTE *)pInLimit);
      lVar22 = *(long *)litEnd;
      UVar36 = (int)litEnd - iVar33;
      pUVar11[(ulong)(lVar22 * -0x30e4432345000000) >> (bVar18 & 0x3f)] = UVar36;
      pUVar10[(ulong)(lVar22 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = UVar36;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar35 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001b2ea1;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
      pBVar13 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar13) goto LAB_001b2ec0;
      if (pInLimit < litEnd) goto LAB_001b2edf;
      if (plVar1 < litEnd) {
        ZSTD_safecopyLiterals(pBVar13,litEnd,litEnd,(BYTE *)plVar1);
      }
      else {
        uVar14 = *(undefined8 *)(litEnd + 8);
        *(undefined8 *)pBVar13 = *(undefined8 *)litEnd;
        *(undefined8 *)(pBVar13 + 8) = uVar14;
      }
      psVar35 = seqStore->sequences;
      psVar35->litLength = 0;
      psVar35->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_001b2e63;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2efe;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar35->mlBase = (U16)(sVar16 + 1);
      psVar35 = psVar35 + 1;
      seqStore->sequences = psVar35;
      uVar25 = uVar38;
      uVar38 = uVar31;
    }
    local_c8 = (long *)litEnd;
  }
  goto LAB_001b1d45;
LAB_001b1807:
  if ((uVar19 < pUVar10[uVar25]) && (*plVar39 == lVar12)) {
    sVar16 = ZSTD_count((BYTE *)(plVar26 + 1),(BYTE *)(plVar39 + 1),(BYTE *)pInLimit);
    uVar29 = sVar16 + 8;
    uVar32 = (long)plVar26 - (long)plVar39;
    for (litEnd = (BYTE *)plVar26;
        ((plVar2 < plVar39 && (local_c8 < litEnd)) && (litEnd[-1] == *(BYTE *)((long)plVar39 + -1)))
        ; litEnd = litEnd + -1) {
      plVar39 = (long *)((long)plVar39 + -1);
      uVar29 = uVar29 + 1;
    }
  }
  else {
    sVar16 = ZSTD_count(litEnd + 4,(BYTE *)((long)plVar34 + 4),(BYTE *)pInLimit);
    uVar29 = sVar16 + 4;
    uVar32 = (long)litEnd - (long)plVar34;
    for (; ((plVar2 < plVar34 && (local_c8 < litEnd)) &&
           (litEnd[-1] == *(BYTE *)((long)plVar34 + -1))); litEnd = litEnd + -1) {
      plVar34 = (long *)((long)plVar34 + -1);
      uVar29 = uVar29 + 1;
    }
  }
LAB_001b1882:
  if (uVar21 < 4) {
    pUVar10[uVar25] = (int)plVar26 - iVar33;
  }
  if ((int)uVar32 == 0) goto LAB_001b2f3c;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001b2ea1;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
  uVar38 = (long)litEnd - (long)local_c8;
  plVar34 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar34 + uVar38)) goto LAB_001b2ec0;
  if (pInLimit < litEnd) goto LAB_001b2edf;
  if (plVar1 < litEnd) {
    ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)local_c8,litEnd,(BYTE *)plVar1);
  }
  else {
    lVar22 = local_c8[1];
    *plVar34 = *local_c8;
    plVar34[1] = lVar22;
    pBVar13 = seqStore->lit;
    if (uVar38 < 0x11) {
      seqStore->lit = pBVar13 + uVar38;
      goto LAB_001b1a93;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar13 + 0x10) + (-0x10 - (long)(local_c8 + 2))))
    goto LAB_001b2f7a;
    lVar22 = local_c8[3];
    *(long *)(pBVar13 + 0x10) = local_c8[2];
    *(long *)(pBVar13 + 0x18) = lVar22;
    if (0x20 < (long)uVar38) {
      lVar22 = 0;
      do {
        puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x20);
        uVar14 = puVar4[1];
        pBVar3 = pBVar13 + lVar22 + 0x20;
        *(undefined8 *)pBVar3 = *puVar4;
        *(undefined8 *)(pBVar3 + 8) = uVar14;
        puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x30);
        uVar14 = puVar4[1];
        *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
        *(undefined8 *)(pBVar3 + 0x18) = uVar14;
        lVar22 = lVar22 + 0x20;
      } while (pBVar3 + 0x20 < pBVar13 + uVar38);
    }
  }
  seqStore->lit = seqStore->lit + uVar38;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2f5b;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b1a93:
  psVar35 = seqStore->sequences;
  psVar35->litLength = (U16)uVar38;
  psVar35->offBase = (int)uVar32 + 3;
  if (uVar29 < 3) goto LAB_001b2e63;
  uVar21 = uVar29 - 3;
  if (uVar21 < 0x10000) {
    uVar38 = uVar31 & 0xffffffff;
  }
  else {
    uVar38 = uVar31 & 0xffffffff;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2efe;
LAB_001b1aca:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b1ae5:
  litEnd = litEnd + uVar29;
  psVar35->mlBase = (U16)uVar21;
  psVar35 = psVar35 + 1;
  seqStore->sequences = psVar35;
  uVar31 = uVar32;
  local_c8 = (long *)litEnd;
  if (litEnd <= plVar27) {
    uVar37 = UVar36 + 2;
    lVar22 = *(long *)(pBVar9 + uVar37);
    pUVar10[(ulong)(lVar22 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = uVar37;
    pUVar10[(ulong)(*(long *)((long)litEnd + -2) * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] =
         ((int)litEnd + -2) - iVar33;
    pUVar11[(ulong)(lVar22 * -0x30e4432340650000) >> (bVar18 & 0x3f)] = uVar37;
    pUVar11[(ulong)(*(long *)((long)litEnd + -1) * -0x30e4432340650000) >> (bVar18 & 0x3f)] =
         ((int)litEnd + -1) - iVar33;
    for (; litEnd <= plVar27; litEnd = litEnd + sVar16 + 4) {
      if (((int)uVar38 == 0) || (*(int *)litEnd != *(int *)(litEnd + -uVar38))) break;
      uVar21 = uVar31 & 0xffffffff;
      sVar16 = ZSTD_count(litEnd + 4,litEnd + (4 - uVar38),(BYTE *)pInLimit);
      lVar22 = *(long *)litEnd;
      UVar36 = (int)litEnd - iVar33;
      pUVar11[(ulong)(lVar22 * -0x30e4432340650000) >> (bVar18 & 0x3f)] = UVar36;
      pUVar10[(ulong)(lVar22 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = UVar36;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar35 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001b2ea1;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
      pBVar13 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar13) goto LAB_001b2ec0;
      if (pInLimit < litEnd) goto LAB_001b2edf;
      if (plVar1 < litEnd) {
        ZSTD_safecopyLiterals(pBVar13,litEnd,litEnd,(BYTE *)plVar1);
      }
      else {
        uVar14 = *(undefined8 *)(litEnd + 8);
        *(undefined8 *)pBVar13 = *(undefined8 *)litEnd;
        *(undefined8 *)(pBVar13 + 8) = uVar14;
      }
      psVar35 = seqStore->sequences;
      psVar35->litLength = 0;
      psVar35->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_001b2e63;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2efe;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar35->mlBase = (U16)(sVar16 + 1);
      psVar35 = psVar35 + 1;
      seqStore->sequences = psVar35;
      uVar31 = uVar38;
      uVar38 = uVar21;
    }
    local_c8 = (long *)litEnd;
  }
  goto LAB_001b14d2;
LAB_001b28ef:
  if ((uVar19 < pUVar10[uVar21]) && (*plVar39 == lVar22)) {
    sVar16 = ZSTD_count((BYTE *)(plVar26 + 1),(BYTE *)(plVar39 + 1),(BYTE *)pInLimit);
    uVar25 = sVar16 + 8;
    uVar31 = (long)plVar26 - (long)plVar39;
    for (litEnd = (BYTE *)plVar26;
        ((plVar2 < plVar39 && (local_c8 < litEnd)) && (litEnd[-1] == *(BYTE *)((long)plVar39 + -1)))
        ; litEnd = litEnd + -1) {
      plVar39 = (long *)((long)plVar39 + -1);
      uVar25 = uVar25 + 1;
    }
  }
  else {
    sVar16 = ZSTD_count(litEnd + 4,(BYTE *)((long)plVar34 + 4),(BYTE *)pInLimit);
    uVar25 = sVar16 + 4;
    uVar31 = (long)litEnd - (long)plVar34;
    for (; ((plVar2 < plVar34 && (local_c8 < litEnd)) &&
           (litEnd[-1] == *(BYTE *)((long)plVar34 + -1))); litEnd = litEnd + -1) {
      plVar34 = (long *)((long)plVar34 + -1);
      uVar25 = uVar25 + 1;
    }
  }
LAB_001b29e0:
  if (uVar38 < 4) {
    pUVar10[uVar21] = (int)plVar26 - iVar33;
  }
  if ((int)uVar31 == 0) goto LAB_001b2f3c;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001b2ea1;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
  uVar38 = (long)litEnd - (long)local_c8;
  plVar34 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar34 + uVar38)) goto LAB_001b2ec0;
  if (pInLimit < litEnd) goto LAB_001b2edf;
  if (plVar1 < litEnd) {
    ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)local_c8,litEnd,(BYTE *)plVar1);
  }
  else {
    lVar22 = local_c8[1];
    *plVar34 = *local_c8;
    plVar34[1] = lVar22;
    pBVar13 = seqStore->lit;
    if (uVar38 < 0x11) {
      seqStore->lit = pBVar13 + uVar38;
      goto LAB_001b2b79;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar13 + 0x10) + (-0x10 - (long)(local_c8 + 2))))
    goto LAB_001b2f7a;
    lVar22 = local_c8[3];
    *(long *)(pBVar13 + 0x10) = local_c8[2];
    *(long *)(pBVar13 + 0x18) = lVar22;
    if (0x20 < (long)uVar38) {
      lVar22 = 0;
      do {
        puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x20);
        uVar14 = puVar4[1];
        pBVar3 = pBVar13 + lVar22 + 0x20;
        *(undefined8 *)pBVar3 = *puVar4;
        *(undefined8 *)(pBVar3 + 8) = uVar14;
        puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x30);
        uVar14 = puVar4[1];
        *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
        *(undefined8 *)(pBVar3 + 0x18) = uVar14;
        lVar22 = lVar22 + 0x20;
      } while (pBVar3 + 0x20 < pBVar13 + uVar38);
    }
  }
  seqStore->lit = seqStore->lit + uVar38;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2f5b;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b2b79:
  psVar35 = seqStore->sequences;
  psVar35->litLength = (U16)uVar38;
  psVar35->offBase = (int)uVar31 + 3;
  if (uVar25 < 3) goto LAB_001b2e63;
  uVar38 = uVar25 - 3;
  local_d4 = uVar37;
  if (uVar38 < 0x10000) {
    uVar31 = uVar31 & 0xffffffff;
  }
  else {
    uVar31 = uVar31 & 0xffffffff;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2efe;
LAB_001b2bb6:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b2bd5:
  litEnd = litEnd + uVar25;
  psVar35->mlBase = (U16)uVar38;
  psVar35 = psVar35 + 1;
  seqStore->sequences = psVar35;
  local_c8 = (long *)litEnd;
  if (litEnd <= plVar27) {
    uVar37 = UVar36 + 2;
    pUVar10[(ulong)(*(long *)(pBVar9 + uVar37) * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = uVar37;
    pUVar10[(ulong)(*(long *)((long)litEnd + -2) * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] =
         ((int)litEnd + -2) - iVar33;
    pUVar11[(uint)(*(int *)(pBVar9 + uVar37) * -0x61c8864f) >> (bVar18 & 0x1f)] = uVar37;
    pUVar11[(uint)(*(int *)((long)litEnd + -1) * -0x61c8864f) >> (bVar18 & 0x1f)] =
         ((int)litEnd + -1) - iVar33;
    for (; uVar38 = (ulong)local_d4, litEnd <= plVar27; litEnd = litEnd + sVar16 + 4) {
      iVar23 = *(int *)litEnd;
      if ((local_d4 == 0) || (iVar23 != *(int *)(litEnd + -uVar38))) break;
      local_d4 = (uint)uVar31;
      sVar16 = ZSTD_count(litEnd + 4,litEnd + (4 - uVar38),(BYTE *)pInLimit);
      UVar36 = (int)litEnd - iVar33;
      pUVar11[(uint)(iVar23 * -0x61c8864f) >> (bVar18 & 0x1f)] = UVar36;
      pUVar10[(ulong)(*(long *)litEnd * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = UVar36;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar35 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001b2ea1;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
      pBVar13 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar13) goto LAB_001b2ec0;
      if (pInLimit < litEnd) goto LAB_001b2edf;
      if (plVar1 < litEnd) {
        ZSTD_safecopyLiterals(pBVar13,litEnd,litEnd,(BYTE *)plVar1);
      }
      else {
        uVar14 = *(undefined8 *)(litEnd + 8);
        *(undefined8 *)pBVar13 = *(undefined8 *)litEnd;
        *(undefined8 *)(pBVar13 + 8) = uVar14;
      }
      psVar35 = seqStore->sequences;
      psVar35->litLength = 0;
      psVar35->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_001b2e63;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2efe;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar35->mlBase = (U16)(sVar16 + 1);
      psVar35 = psVar35 + 1;
      seqStore->sequences = psVar35;
      uVar31 = uVar38;
    }
    local_c8 = (long *)litEnd;
  }
  goto LAB_001b25c3;
LAB_001b0f6d:
  if ((uVar19 < pUVar10[uVar25]) && (*plVar39 == lVar12)) {
    sVar16 = ZSTD_count((BYTE *)(plVar26 + 1),(BYTE *)(plVar39 + 1),(BYTE *)pInLimit);
    uVar21 = sVar16 + 8;
    uVar31 = (long)plVar26 - (long)plVar39;
    for (litEnd = (BYTE *)plVar26;
        ((plVar2 < plVar39 && (local_c8 < litEnd)) && (litEnd[-1] == *(BYTE *)((long)plVar39 + -1)))
        ; litEnd = litEnd + -1) {
      plVar39 = (long *)((long)plVar39 + -1);
      uVar21 = uVar21 + 1;
    }
  }
  else {
    sVar16 = ZSTD_count(litEnd + 4,(BYTE *)((long)plVar34 + 4),(BYTE *)pInLimit);
    uVar21 = sVar16 + 4;
    uVar31 = (long)litEnd - (long)plVar34;
    for (; ((plVar2 < plVar34 && (local_c8 < litEnd)) &&
           (litEnd[-1] == *(BYTE *)((long)plVar34 + -1))); litEnd = litEnd + -1) {
      plVar34 = (long *)((long)plVar34 + -1);
      uVar21 = uVar21 + 1;
    }
  }
LAB_001b0fe8:
  if (uVar38 < 4) {
    pUVar10[uVar25] = (int)plVar26 - iVar33;
  }
  if ((int)uVar31 == 0) {
LAB_001b2f3c:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                  ,0x10f,
                  "size_t ZSTD_compressBlock_doubleFast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_001b2ea1:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_001b2e82:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar38 = (long)litEnd - (long)local_c8;
  plVar34 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar34 + uVar38)) {
LAB_001b2ec0:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a0,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (pInLimit < litEnd) {
LAB_001b2edf:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a1,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (plVar1 < litEnd) {
    ZSTD_safecopyLiterals((BYTE *)plVar34,(BYTE *)local_c8,litEnd,(BYTE *)plVar1);
  }
  else {
    lVar22 = local_c8[1];
    *plVar34 = *local_c8;
    plVar34[1] = lVar22;
    pBVar13 = seqStore->lit;
    if (uVar38 < 0x11) {
      seqStore->lit = pBVar13 + uVar38;
      goto LAB_001b1208;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar13 + 0x10) + (-0x10 - (long)(local_c8 + 2)))) {
LAB_001b2f7a:
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                    ,0xe9,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    lVar22 = local_c8[3];
    *(long *)(pBVar13 + 0x10) = local_c8[2];
    *(long *)(pBVar13 + 0x18) = lVar22;
    if (0x20 < (long)uVar38) {
      lVar22 = 0;
      do {
        puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x20);
        uVar14 = puVar4[1];
        pBVar3 = pBVar13 + lVar22 + 0x20;
        *(undefined8 *)pBVar3 = *puVar4;
        *(undefined8 *)(pBVar3 + 8) = uVar14;
        puVar4 = (undefined8 *)((long)local_c8 + lVar22 + 0x30);
        uVar14 = puVar4[1];
        *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
        *(undefined8 *)(pBVar3 + 0x18) = uVar14;
        lVar22 = lVar22 + 0x20;
      } while (pBVar3 + 0x20 < pBVar13 + uVar38);
    }
  }
  seqStore->lit = seqStore->lit + uVar38;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001b2f5b:
      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2b2,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b1208:
  psVar35 = seqStore->sequences;
  psVar35->litLength = (U16)uVar38;
  psVar35->offBase = (int)uVar31 + 3;
  if (uVar21 < 3) {
LAB_001b2e63:
    __assert_fail("matchLength >= MINMATCH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,700,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar38 = uVar21 - 3;
  local_d4 = uVar37;
  if (0xffff < uVar38) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2efe;
LAB_001b1240:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001b125c:
  litEnd = litEnd + uVar21;
  psVar35->mlBase = (U16)uVar38;
  psVar35 = psVar35 + 1;
  seqStore->sequences = psVar35;
  local_c8 = (long *)litEnd;
  if (litEnd <= plVar27) {
    uVar37 = UVar36 + 2;
    lVar22 = *(long *)(pBVar9 + uVar37);
    pUVar10[(ulong)(lVar22 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = uVar37;
    pUVar10[(ulong)(*(long *)((long)litEnd + -2) * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] =
         ((int)litEnd + -2) - iVar33;
    pUVar11[(ulong)(lVar22 * -0x30e44323405a9d00) >> (bVar18 & 0x3f)] = uVar37;
    pUVar11[(ulong)(*(long *)((long)litEnd + -1) * -0x30e44323405a9d00) >> (bVar18 & 0x3f)] =
         ((int)litEnd + -1) - iVar33;
    for (; uVar38 = (ulong)local_d4, litEnd <= plVar27; litEnd = litEnd + sVar16 + 4) {
      if ((local_d4 == 0) || (*(int *)litEnd != *(int *)(litEnd + -uVar38))) break;
      local_d4 = (uint)uVar31;
      sVar16 = ZSTD_count(litEnd + 4,litEnd + (4 - uVar38),(BYTE *)pInLimit);
      lVar22 = *(long *)litEnd;
      UVar36 = (int)litEnd - iVar33;
      pUVar11[(ulong)(lVar22 * -0x30e44323405a9d00) >> (bVar18 & 0x3f)] = UVar36;
      pUVar10[(ulong)(lVar22 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = UVar36;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar35 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001b2ea1;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001b2e82;
      pBVar13 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar13) goto LAB_001b2ec0;
      if (pInLimit < litEnd) goto LAB_001b2edf;
      if (plVar1 < litEnd) {
        ZSTD_safecopyLiterals(pBVar13,litEnd,litEnd,(BYTE *)plVar1);
      }
      else {
        uVar14 = *(undefined8 *)(litEnd + 8);
        *(undefined8 *)pBVar13 = *(undefined8 *)litEnd;
        *(undefined8 *)(pBVar13 + 8) = uVar14;
      }
      psVar35 = seqStore->sequences;
      psVar35->litLength = 0;
      psVar35->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_001b2e63;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b2efe;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar35->mlBase = (U16)(sVar16 + 1);
      psVar35 = psVar35 + 1;
      seqStore->sequences = psVar35;
      uVar31 = uVar38;
    }
    local_c8 = (long *)litEnd;
  }
  goto LAB_001b0c47;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}